

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::test_double(void)

{
  undefined1 local_1bb;
  undefined1 local_1ba [2];
  view_type local_1b8;
  undefined4 local_1a4;
  int local_1a0 [2];
  undefined8 local_198;
  double local_190 [3];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [4];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x302e31;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)((long)&reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x9a,"void basic_suite::test_double()",local_170,&local_174);
  local_190[0] = trial::protocol::json::basic_reader<char>::value<double>
                           ((basic_reader<char> *)local_158);
  local_198 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<double>()","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x9b,"void basic_suite::test_double()",local_190,&local_198);
  local_1a0[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_158);
  local_1a4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x9c,"void basic_suite::test_double()",local_1a0,&local_1a4);
  local_1b8 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[4]>
            ("reader.literal()","\"1.0\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x9d,"void basic_suite::test_double()",&local_1b8,"1.0");
  local_1ba[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1bb = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x9e,"void basic_suite::test_double()",local_1ba,&local_1bb);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void test_double()
{
    const char input[] = "1.0";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<double>(), 1.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1.0");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}